

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<std::optional<unsigned_int>_()>::PerformDefaultAction
          (FunctionMocker<std::optional<unsigned_int>_()> *this,ArgumentTuple *args,
          string *call_description)

{
  pointer pcVar1;
  OnCallSpec<std::optional<unsigned_int>_()> *this_00;
  Action<std::optional<unsigned_int>_()> *pAVar2;
  Result RVar3;
  _Optional_payload_base<unsigned_int> _Var4;
  string message;
  long *local_30 [2];
  long local_20 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<std::optional<unsigned_int>_()> *)0x0) {
    pAVar2 = OnCallSpec<std::optional<unsigned_int>_()>::GetAction(this_00);
    RVar3 = Action<std::optional<unsigned_int>_()>::Perform(pAVar2);
    return (Result)RVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_30);
  if (DefaultValue<std::optional<unsigned_int>>::producer_ == (long *)0x0) {
    _Var4._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
  }
  else {
    _Var4 = (_Optional_payload_base<unsigned_int>)
            (**(code **)(*DefaultValue<std::optional<unsigned_int>>::producer_ + 0x10))();
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return (Result)_Var4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }